

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * toplevel_asm_declaration(dmr_C *C,token *token,symbol_list **list)

{
  symbol *sym;
  symbol *psVar1;
  statement *stmt_00;
  token *ptVar2;
  statement *stmt;
  symbol *fn;
  symbol *anon;
  symbol_list **list_local;
  token *token_local;
  dmr_C *C_local;
  
  sym = dmrC_alloc_symbol(C->S,token->pos,3);
  psVar1 = dmrC_alloc_symbol(C->S,token->pos,5);
  (sym->field_14).field_2.ctype.base_type = psVar1;
  stmt_00 = dmrC_alloc_statement(C,token->pos,0);
  (psVar1->field_14).field_2.stmt = stmt_00;
  ptVar2 = parse_asm_statement(C,token,stmt_00);
  dmrC_add_symbol(C,list,sym);
  return ptVar2;
}

Assistant:

static struct token *toplevel_asm_declaration(struct dmr_C *C, struct token *token, struct symbol_list **list)
{
	struct symbol *anon = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
	struct symbol *fn = dmrC_alloc_symbol(C->S, token->pos, SYM_FN);
	struct statement *stmt;

	anon->ctype.base_type = fn;
	stmt = dmrC_alloc_statement(C, token->pos, STMT_NONE);
	fn->stmt = stmt;

	token = parse_asm_statement(C, token, stmt);

	dmrC_add_symbol(C, list, anon);
	return token;
}